

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

int Lf_ObjCoArrival2_rec(Lf_Man_t *p,Gia_Obj_t *pDriver)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Lf_Bst_t *pLVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  
  uVar8 = *(ulong *)pDriver;
  uVar6 = (uint)(uVar8 >> 0x20);
  uVar10 = uVar6 & 0x1fffffff;
  bVar11 = (uVar8 & 0x80000000) == 0;
  if (((bVar11) && (uVar5 = (uint)uVar8 & 0x1fffffff, uVar5 != 0x1fffffff)) && (uVar5 == uVar10)) {
    do {
      pDriver = pDriver + -(ulong)((uint)uVar8 & 0x1fffffff);
      uVar8 = *(ulong *)pDriver;
      uVar6 = (uint)(uVar8 >> 0x20);
      uVar10 = uVar6 & 0x1fffffff;
      bVar11 = (uVar8 & 0x80000000) == 0;
      if ((!bVar11) || (uVar5 = (uint)uVar8 & 0x1fffffff, uVar5 == 0x1fffffff)) break;
    } while (uVar5 == uVar10);
  }
  if ((bool)(bVar11 ^ 1U | (~(uint)uVar8 & 0x1fffffff) == 0)) {
    if ((~(uint)uVar8 & 0x9fffffff) != 0) {
      return 0;
    }
    if (bVar11) {
      __assert_fail("pObj->fTerm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
    }
    if ((p->vCiArrivals).nSize <= (int)uVar10) goto LAB_0076466d;
    piVar7 = (int *)((ulong)((uVar6 & 0x1fffffff) << 2) + (long)(p->vCiArrivals).pArray);
  }
  else {
    pGVar2 = p->pGia;
    pGVar3 = pGVar2->pObjs;
    if ((pDriver < pGVar3) || (pGVar3 + pGVar2->nObjs <= pDriver)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar6 = (int)((long)pDriver - (long)pGVar3 >> 2) * -0x55555555;
    if (((int)uVar6 < 0) || ((p->vOffsets).nSize <= (int)uVar6)) {
LAB_0076466d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pLVar4 = p->pObjBests;
    iVar1 = (p->vOffsets).pArray[uVar6 & 0x7fffffff];
    if (((uint)pLVar4[iVar1].Cut[0] & 1) == 0) {
      lVar9 = 1;
      if ((((uint)pLVar4[iVar1].Cut[1] & 1) == 0) &&
         ((pGVar2->pMuxes == (uint *)0x0 || (lVar9 = 2, pGVar2->pMuxes[uVar6 & 0x7fffffff] == 0))))
      {
        __assert_fail("Index < 2 || Gia_ObjIsMux(p->pGia, pDriver)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                      ,0xbf,"int Lf_ObjCoArrival2_rec(Lf_Man_t *, Gia_Obj_t *)");
      }
    }
    else {
      lVar9 = 0;
    }
    piVar7 = pLVar4[iVar1].Delay + lVar9;
  }
  return *piVar7;
}

Assistant:

int Lf_ObjCoArrival2_rec( Lf_Man_t * p, Gia_Obj_t * pDriver )
{
    if ( Gia_ObjIsBuf(pDriver) )
        return Lf_ObjCoArrival2_rec( p, Gia_ObjFanin0(pDriver) );
    if ( Gia_ObjIsAnd(pDriver) )
    {
        Lf_Bst_t * pBest = Lf_ObjReadBest(p, Gia_ObjId(p->pGia, pDriver));
        int Index = Lf_BestCutIndex( pBest );
        assert( Index < 2 || Gia_ObjIsMux(p->pGia, pDriver) );
        return pBest->Delay[Index];
    }
    if ( Gia_ObjIsCi(pDriver) )
        return Lf_ObjCiArrival(p, Gia_ObjCioId(pDriver));
    return 0;
}